

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportDirWrapper.cpp
# Opt level: O3

char * __thiscall ImportEntryWrapper::getLibraryName(ImportEntryWrapper *this)

{
  Executable *pEVar1;
  size_t maxLen;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *inp;
  undefined4 extraout_var_02;
  bufsize_t bVar4;
  char *pcVar5;
  undefined4 extraout_var_01;
  
  iVar3 = (*(this->super_ImportBaseEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
            super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xc])();
  if (CONCAT44(extraout_var,iVar3) == 0) {
    pcVar5 = (char *)0x0;
  }
  else {
    pEVar1 = (this->super_ImportBaseEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
             super_ExeElementWrapper.m_Exe;
    iVar3 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x18])
                      (pEVar1,(ulong)*(uint *)(CONCAT44(extraout_var,iVar3) + 0xc),2,0);
    pcVar5 = (char *)0x0;
    if (CONCAT44(extraout_var_00,iVar3) != -1) {
      pEVar1 = (this->super_ImportBaseEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
               super_ExeElementWrapper.m_Exe;
      iVar3 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[7])
                        (pEVar1,CONCAT44(extraout_var_00,iVar3),1,0);
      inp = (char *)CONCAT44(extraout_var_01,iVar3);
      (*(((this->super_ImportBaseEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
          super_ExeElementWrapper.m_Exe)->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xd])()
      ;
      pEVar1 = (this->super_ImportBaseEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
               super_ExeElementWrapper.m_Exe;
      iVar3 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[6])(pEVar1,inp,0);
      bVar4 = AbstractByteBuffer::getMaxSizeFromOffset
                        (&pEVar1->super_AbstractByteBuffer,CONCAT44(extraout_var_02,iVar3));
      pcVar5 = (char *)0x0;
      maxLen = ImportBaseEntryWrapper::NameLenLimit;
      if (bVar4 < ImportBaseEntryWrapper::NameLenLimit) {
        pcVar5 = inp;
        maxLen = bVar4;
      }
      bVar2 = pe_util::isStrLonger(inp,maxLen);
      if (!bVar2) {
        pcVar5 = inp;
      }
    }
  }
  return pcVar5;
}

Assistant:

char* ImportEntryWrapper::getLibraryName()
{
    IMAGE_IMPORT_DESCRIPTOR* desc = (IMAGE_IMPORT_DESCRIPTOR*) getPtr();
    if (!desc) {
        return NULL;
    }

    offset_t nameRVA = desc->Name;
    offset_t nAddr = m_Exe->toRaw(nameRVA, Executable::RVA);
    if (nAddr == INVALID_ADDR) return NULL;

    //TODO: reimplement it:
    char *name = (char*) m_Exe->getContentAt(nAddr, sizeof(char));
    offset_t peSize = m_Exe->getRawSize();

    bufsize_t upperLimit = m_Exe->getMaxSizeFromPtr((BYTE*) name);
    bufsize_t HARD_LIMIT = ImportEntryWrapper::NameLenLimit;
    size_t limit = (size_t) upperLimit < HARD_LIMIT ? upperLimit : HARD_LIMIT;

    if (pe_util::isStrLonger(name, limit)) {
        if (upperLimit < HARD_LIMIT) {
            return name; // Name at the end of File. FileBuffer secures it with appended \0
        }
        return NULL;
    }
    return name;
}